

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O3

int imcomp_nullfloats(float *fdata,long tilelen,int *idata,int nullcheck,float nullflagval,
                     int nullval,int *status)

{
  float fVar1;
  float fVar2;
  long lVar3;
  int iVar4;
  
  if (nullcheck == 1) {
    if (0 < tilelen) {
      lVar3 = 0;
      do {
        fVar1 = fdata[lVar3];
        if ((fVar1 != nullflagval) || (NAN(fVar1) || NAN(nullflagval))) {
          if (-2.1474836e+09 <= fVar1) {
            if (fVar1 <= 2.1474836e+09) {
              fVar2 = 0.5;
              if (fVar1 < 0.0) {
                fVar2 = -0.5;
              }
              idata[lVar3] = (int)(fVar1 + fVar2);
            }
            else {
              *status = -0xb;
              idata[lVar3] = 0x7fffffff;
            }
          }
          else {
            *status = -0xb;
            idata[lVar3] = -0x80000000;
          }
        }
        else {
          idata[lVar3] = nullval;
        }
        lVar3 = lVar3 + 1;
      } while (tilelen != lVar3);
    }
  }
  else if (0 < tilelen) {
    lVar3 = 0;
    do {
      fVar1 = fdata[lVar3];
      if (-2.1474836e+09 <= fVar1) {
        if (fVar1 <= 2.1474836e+09) {
          fVar2 = 0.5;
          if (fVar1 < 0.0) {
            fVar2 = -0.5;
          }
          iVar4 = (int)(fVar1 + fVar2);
        }
        else {
          *status = -0xb;
          iVar4 = 0x7fffffff;
        }
      }
      else {
        *status = -0xb;
        iVar4 = -0x80000000;
      }
      idata[lVar3] = iVar4;
      lVar3 = lVar3 + 1;
    } while (tilelen != lVar3);
  }
  return *status;
}

Assistant:

int imcomp_nullfloats(
     float *fdata,
     long tilelen,
     int *idata, 
     int nullcheck,
     float nullflagval,
     int nullval,
     int *status)
/*
   do null value substitution  of the float array.
   If array value = nullflagval, then set the output value to FLOATNULLVALUE.
*/
{
    long ii;
    double dvalue;
    
    if (nullcheck == 1) /* must check for null values */
    {
      for (ii=0; ii < tilelen; ii++)
      {
        if (fdata[ii] == nullflagval)
	    idata[ii] = nullval;
	else 
	{
            dvalue = fdata[ii];

            if (dvalue < DINT_MIN)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MIN;
            }
            else if (dvalue > DINT_MAX)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MAX;
            }
            else
            {
                if (dvalue >= 0)
                    idata[ii] = (int) (dvalue + .5);
                else
                    idata[ii] = (int) (dvalue - .5);
            }
        }
      }
    }
    else  /* don't have to worry about null values */
    {
      for (ii=0; ii < tilelen; ii++)
      {
            dvalue = fdata[ii];

            if (dvalue < DINT_MIN)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MIN;
            }
            else if (dvalue > DINT_MAX)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MAX;
            }
            else
            {
                if (dvalue >= 0)
                    idata[ii] = (int) (dvalue + .5);
                else
                    idata[ii] = (int) (dvalue - .5);
            }
      }
    }
    return(*status);
}